

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-flow-kill.c
# Opt level: O3

void borg_delete_kill(wchar_t i)

{
  ushort uVar1;
  wchar_t wVar2;
  _Bool _Var3;
  char *pcVar4;
  wchar_t wVar5;
  borg_kill *__s;
  
  uVar1 = borg_kills[i].r_idx;
  if (uVar1 != 0) {
    __s = borg_kills + i;
    if ((int)(uint)uVar1 < (int)(z_info->r_max - 1)) {
      pcVar4 = r_info[(uint)uVar1].name;
    }
    else {
      pcVar4 = "player ghost";
    }
    pcVar4 = format("# Forgetting a monster \'%s\' at (%d,%d)",pcVar4,(ulong)(uint)(__s->pos).y,
                    (ulong)(uint)(__s->pos).x);
    borg_note(pcVar4);
    wVar2 = (__s->pos).y;
    if (borg.goal.type == 1) {
      wVar5 = (__s->pos).x;
      if ((wVar2 == (uint)borg_flow_y[0]) && (wVar5 == (uint)borg_flow_x[0])) {
        borg.goal.type = 0;
      }
    }
    else {
      wVar5 = (__s->pos).x;
    }
    borg_grids[wVar2][wVar5].kill = '\0';
    _Var3 = flag_has_dbg(r_info[__s->r_idx].flags,0xb,0x11,"r_info[kill->r_idx].flags","RF_MULTIPLY"
                        );
    if (_Var3) {
      borg.when_last_kill_mult = borg_t;
    }
    memset(__s,0,0x1d8);
    borg_kills_cnt = borg_kills_cnt + -1;
    borg_danger_wipe = true;
  }
  return;
}

Assistant:

void borg_delete_kill(int i)
{
    borg_kill *kill = &borg_kills[i];

    /* Paranoia -- Already wiped */
    if (!kill->r_idx)
        return;

    /* Note */
    borg_note(format("# Forgetting a monster '%s' at (%d,%d)",
        borg_race_name(kill->r_idx), kill->pos.y, kill->pos.x));
    /* Clear goals if I am flowing to this monster.*/
    if (borg.goal.type == GOAL_KILL && borg_flow_y[0] == kill->pos.y
        && borg_flow_x[0] == kill->pos.x)
        borg.goal.type = 0;

    /* Update the grids */
    borg_grids[kill->pos.y][kill->pos.x].kill = 0;

    /* save a time stamp of when the last multiplier was killed */
    if (rf_has(r_info[kill->r_idx].flags, RF_MULTIPLY))
        borg.when_last_kill_mult = borg_t;

    /* Kill the monster */
    memset(kill, 0, sizeof(borg_kill));

    /* One less monster */
    borg_kills_cnt--;

    /* Recalculate danger */
    borg_danger_wipe = true;
}